

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Node::resolve
          (Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Node *this,StringPtr name)

{
  StringPtr name_00;
  bool bVar1;
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  *other;
  OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
  *pOVar2;
  OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter> *t;
  unsigned_long *puVar3;
  Impl *pIVar4;
  StringPtr name_01;
  ResolvedDecl local_360;
  undefined1 local_300 [8];
  ResolveResult result_1;
  Node *b;
  undefined1 local_280 [16];
  Node *_b886;
  ChunkHeader *local_268;
  Node *local_260;
  Node *p;
  Node *_p884;
  uint local_248;
  undefined1 local_240 [8];
  ResolveResult result;
  ArrayPtr<const_char> local_1a8;
  uint local_194;
  Iterator IStack_190;
  uint i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  Reader params;
  OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
  *member;
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_108;
  undefined1 local_98 [8];
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  _member868;
  Node *this_local;
  StringPtr name_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (Node *)name.content.ptr;
  _member868.field_1._96_8_ = this;
  name_local.content.size_ = (size_t)__return_storage_ptr__;
  resolveMember(&local_108,this,name);
  other = kj::_::
          readMaybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,capnp::compiler::Resolver::ResolvedParameter>>
                    (&local_108);
  kj::_::
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  ::NullableValue((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                   *)local_98,other);
  kj::
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  ::~Maybe(&local_108);
  pOVar2 = kj::_::NullableValue::operator_cast_to_OneOf_((NullableValue *)local_98);
  if (pOVar2 != (OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                 *)0x0) {
    t = kj::_::
        NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
        ::operator*((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                     *)local_98);
    kj::
    Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::Maybe(__return_storage_ptr__,t);
  }
  params.reader._45_3_ = 0;
  params.reader._44_1_ =
       pOVar2 != (OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                  *)0x0;
  kj::_::
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  ::~NullableValue((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                    *)local_98);
  if (params.reader._44_4_ == 0) {
    Declaration::Reader::getParameters((Reader *)&__range2,&this->declaration);
    ___begin2 = kj::
                indices<capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
                          ((Reader *)&__range2);
    __end2 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
    IStack_190 = kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
    while (bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end2,&stack0xfffffffffffffe70),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      puVar3 = kj::Range<unsigned_long>::Iterator::operator*(&__end2);
      local_194 = (uint)*puVar3;
      List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::operator[]
                ((Reader *)((long)&result.field_1 + 0x58),(Reader *)&__range2,local_194);
      local_1a8 = (ArrayPtr<const_char>)
                  Declaration::BrandParameter::Reader::getName
                            ((Reader *)((long)&result.field_1 + 0x58));
      bVar1 = kj::StringPtr::operator==((StringPtr *)&local_1a8,(StringPtr *)&this_local);
      if (bVar1) {
        kj::
        OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
        ::OneOf((OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                 *)local_240);
        _p884 = (Node *)this->id;
        local_248 = local_194;
        kj::
        OneOf<capnp::compiler::Resolver::ResolvedDecl,capnp::compiler::Resolver::ResolvedParameter>
        ::
        init<capnp::compiler::Resolver::ResolvedParameter,capnp::compiler::Resolver::ResolvedParameter>
                  ((OneOf<capnp::compiler::Resolver::ResolvedDecl,capnp::compiler::Resolver::ResolvedParameter>
                    *)local_240,(ResolvedParameter *)&_p884);
        kj::
        Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
        ::Maybe(__return_storage_ptr__,
                (OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                 *)local_240);
        params.reader._44_4_ = 1;
        kj::
        OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
        ::~OneOf((OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                  *)local_240);
        return __return_storage_ptr__;
      }
      kj::Range<unsigned_long>::Iterator::operator++(&__end2);
    }
    local_260 = kj::_::readMaybe<capnp::compiler::Compiler::Node>(&this->parent);
    p = local_260;
    if (local_260 == (Node *)0x0) {
      pIVar4 = CompiledModule::getCompiler(this->module);
      name_01.content.size_ = (size_t)this_local;
      name_01.content.ptr = (char *)pIVar4;
      Compiler::Impl::lookupBuiltin((Impl *)local_280,name_01);
      result_1.field_1._88_8_ =
           kj::_::readMaybe<capnp::compiler::Compiler::Node>
                     ((Maybe<capnp::compiler::Compiler::Node_&> *)local_280);
      local_280._8_8_ = result_1.field_1._88_8_;
      if ((Node *)result_1.field_1._88_8_ == (Node *)0x0) {
        kj::
        Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
        ::Maybe(__return_storage_ptr__);
      }
      else {
        kj::
        OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
        ::OneOf((OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                 *)local_300);
        local_360.id = *(uint64_t *)(result_1.field_1._88_8_ + 0x48);
        local_360.genericParamCount = *(uint *)(result_1.field_1._88_8_ + 100);
        local_360.scopeId = 0;
        local_360.kind = *(Which *)(result_1.field_1._88_8_ + 0x60);
        local_360.resolver = (Resolver *)result_1.field_1._88_8_;
        kj::Maybe<capnp::schema::Brand::Reader>::Maybe(&local_360.brand);
        kj::
        OneOf<capnp::compiler::Resolver::ResolvedDecl,capnp::compiler::Resolver::ResolvedParameter>
        ::init<capnp::compiler::Resolver::ResolvedDecl,capnp::compiler::Resolver::ResolvedDecl>
                  ((OneOf<capnp::compiler::Resolver::ResolvedDecl,capnp::compiler::Resolver::ResolvedParameter>
                    *)local_300,&local_360);
        Resolver::ResolvedDecl::~ResolvedDecl(&local_360);
        kj::
        Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
        ::Maybe(__return_storage_ptr__,
                (OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                 *)local_300);
        params.reader._44_4_ = 1;
        kj::
        OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
        ::~OneOf((OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                  *)local_300);
      }
    }
    else {
      _b886 = this_local;
      local_268 = (ChunkHeader *)name_local.content.ptr;
      name_00.content.size_ = (size_t)name_local.content.ptr;
      name_00.content.ptr = (char *)this_local;
      resolve(__return_storage_ptr__,local_260,name_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Resolver::ResolveResult>
Compiler::Node::resolve(kj::StringPtr name) {
  // Check members.
  KJ_IF_SOME(member, resolveMember(name)) {
    return member;
  }

  // Check parameters.
  // TODO(perf): Maintain a map?
  auto params = declaration.getParameters();
  for (uint i: kj::indices(params)) {
    if (params[i].getName() == name) {
      ResolveResult result;
      result.init<ResolvedParameter>(ResolvedParameter {id, i});
      return result;
    }
  }

  // Check parent scope.
  KJ_IF_SOME(p, parent) {
    return p.resolve(name);
  } else KJ_IF_SOME(b, module->getCompiler().lookupBuiltin(name)) {
    ResolveResult result;
    result.init<ResolvedDecl>(ResolvedDecl { b.id, b.genericParamCount, 0, b.kind, &b, kj::none });
    return result;
  } else {
    return kj::none;
  }
}